

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint32_t helper_qsub8_arm(uint32_t a,uint32_t b)

{
  byte bVar1;
  byte bVar2;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar3;
  
  bVar3 = (byte)a;
  bVar2 = bVar3 - (byte)b;
  bVar1 = 0x7f - ((char)bVar3 >> 7);
  if (-1 < (char)((bVar2 ^ bVar3) & ((byte)b ^ bVar3))) {
    bVar1 = bVar2;
  }
  bVar3 = (byte)(b >> 8);
  bVar7 = (byte)(a >> 8);
  bVar6 = bVar7 - bVar3;
  bVar2 = 0x7f - ((char)bVar7 >> 7);
  if (-1 < (char)((bVar6 ^ bVar7) & (bVar3 ^ bVar7))) {
    bVar2 = bVar6;
  }
  bVar6 = (byte)(b >> 0x10);
  bVar4 = (byte)(a >> 0x10);
  bVar7 = bVar4 - bVar6;
  bVar3 = 0x7f - ((char)bVar4 >> 7);
  if (-1 < (char)((bVar7 ^ bVar4) & (bVar6 ^ bVar4))) {
    bVar3 = bVar7;
  }
  bVar4 = (byte)(a >> 0x18);
  bVar5 = (byte)(b >> 0x18);
  bVar7 = bVar4 - bVar5;
  bVar6 = 0x80 - (-1 < (int)a);
  if (-1 < (char)((bVar7 ^ bVar4) & (bVar5 ^ bVar4))) {
    bVar6 = bVar7;
  }
  return CONCAT13(bVar6,CONCAT12(bVar3,CONCAT11(bVar2,bVar1)));
}

Assistant:

static inline uint8_t sub8_sat(uint8_t a, uint8_t b)
{
    uint8_t res;

    res = a - b;
    if (((res ^ a) & 0x80) && ((a ^ b) & 0x80)) {
        if (a & 0x80)
            res = 0x80;
        else
            res = 0x7f;
    }
    return res;
}